

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# st_formatter.h
# Opt level: O1

char __thiscall ST::format_writer::fetch_prefix(format_writer *this)

{
  char cVar1;
  char *pcVar2;
  
  pcVar2 = this->m_format_str;
  do {
    cVar1 = *pcVar2;
    if (cVar1 == '{') {
      if (pcVar2[1] != '{') {
LAB_001a6057:
        if (pcVar2 != this->m_format_str) {
          (*this->_vptr_format_writer[2])(this);
        }
        this->m_format_str = pcVar2;
        return *pcVar2;
      }
LAB_001a6034:
      (*this->_vptr_format_writer[2])
                (this,this->m_format_str,(long)pcVar2 - (long)this->m_format_str);
      this->m_format_str = pcVar2 + 1;
      pcVar2 = pcVar2 + 1;
    }
    else if (cVar1 == '}') {
      if (pcVar2[1] == '}') goto LAB_001a6034;
    }
    else if (cVar1 == '\0') goto LAB_001a6057;
    pcVar2 = pcVar2 + 1;
  } while( true );
}

Assistant:

ST_NODISCARD
        char fetch_prefix()
        {
            const char *next = m_format_str;
            while (*next) {
                if (*next == '{') {
                    if (*(next + 1) != '{')
                        break;

                    append(m_format_str, next - m_format_str);
                    m_format_str = ++next;
                } else if (*next == '}') {
                    if (*(next + 1) == '}') {
                        append(m_format_str, next - m_format_str);
                        m_format_str = ++next;
                    }
                }
                ++next;
            }
            if (next != m_format_str)
                append(m_format_str, next - m_format_str);
            m_format_str = next;

            return *m_format_str;
        }